

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  sqlite3 *psVar5;
  WhereLoop *pWVar6;
  ulong uVar7;
  ulong uVar8;
  WhereInfo *pWInfo_00;
  byte bVar9;
  i8 iVar10;
  LogEst LVar11;
  LogEst LVar12;
  short sVar13;
  LogEst LVar14;
  int iVar15;
  int extraout_EAX;
  WherePath *pWVar16;
  WhereLoop ***pppWVar17;
  LogEst *pLVar18;
  WhereLoop **ppWVar19;
  uint uVar20;
  ulong uVar21;
  short sVar22;
  short sVar23;
  WherePath *pWVar24;
  int iVar25;
  undefined6 in_register_00000032;
  WherePath *pWVar26;
  ExprList *pOrderBy;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  WherePath *local_f0;
  Bitmask revMask;
  int local_d8;
  uint local_d4;
  ulong local_d0;
  uint local_c8;
  uint local_c4;
  WhereLoop **local_c0;
  WherePath *local_b8;
  undefined8 local_b0;
  WhereInfo *local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  int local_84;
  uint local_80;
  uint local_7c;
  Parse *local_78;
  ulong local_70;
  sqlite3 *local_68;
  ulong local_60;
  LogEst *local_58;
  ulong local_50;
  WhereLoop **local_48;
  WherePath *local_40;
  size_t local_38;
  
  local_b0 = CONCAT62(in_register_00000032,nRowEst);
  local_78 = pWInfo->pParse;
  psVar5 = local_78->db;
  bVar9 = pWInfo->nLevel;
  local_a0 = (ulong)(bVar9 != 2) * 5 + 5;
  if (bVar9 < 2) {
    local_a0 = 1;
  }
  local_d8 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    local_d8 = pWInfo->pOrderBy->nExpr;
  }
  iVar25 = (int)local_a0 * 2;
  lVar32 = (long)local_d8;
  pWVar16 = (WherePath *)
            sqlite3DbMallocRawNN
                      (psVar5,(long)(int)(((uint)bVar9 * 8 + 0x20) * iVar25 + (int)(lVar32 * 2)));
  if (pWVar16 == (WherePath *)0x0) {
    return 0;
  }
  uVar21 = (ulong)(uint)((int)local_a0 << 5);
  pWVar26 = (WherePath *)((long)&pWVar16->maskLoop + uVar21);
  puVar1 = (undefined8 *)((long)&pWVar16->nRow + uVar21);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&pWVar16->maskLoop + uVar21);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_c0 = (WhereLoop **)((long)&pWVar26->maskLoop + uVar21);
  pppWVar17 = &pWVar16->aLoop;
  for (; 0 < iVar25; iVar25 = iVar25 + -1) {
    *pppWVar17 = local_c0;
    pppWVar17 = pppWVar17 + 4;
    local_c0 = (WhereLoop **)((long)local_c0 + (ulong)((uint)bVar9 * 8));
  }
  local_68 = psVar5;
  if (local_d8 == 0) {
    local_c0 = (WhereLoop **)0x0;
  }
  else {
    memset(local_c0,0,lVar32 * 2);
  }
  uVar31 = 0x30;
  if (local_78->nQueryLoop < 0x30) {
    uVar31 = local_78->nQueryLoop;
  }
  pWVar26->nRow = (LogEst)uVar31;
  if (local_d8 != 0) {
    pWVar26->isOrdered = -(bVar9 != 0) | (byte)local_d8;
  }
  local_48 = &pWInfo->pLoops;
  local_84 = (int)local_b0 + -0x32;
  uVar21 = 0;
  uVar31 = 1;
  uVar28 = 0;
  uVar29 = 0;
  uVar30 = 0;
  local_b8 = pWVar16;
  local_a8 = pWInfo;
  local_70 = (ulong)bVar9;
  local_60 = (ulong)bVar9;
  local_40 = pWVar16;
  do {
    pWVar24 = pWVar26;
    uVar7 = local_60;
    psVar5 = local_68;
    pWInfo_00 = local_a8;
    if (uVar21 == local_70) {
      if (uVar31 == 0) {
        sqlite3ErrorMsg(local_78,"no query solution");
      }
      else {
        local_f0 = pWVar24;
        for (lVar32 = 1; lVar32 < (int)uVar31; lVar32 = lVar32 + 1) {
          pWVar26 = pWVar24 + 1;
          if (local_f0->rCost <= pWVar24[1].rCost) {
            pWVar26 = local_f0;
          }
          pWVar24 = pWVar24 + 1;
          local_f0 = pWVar26;
        }
        ppWVar19 = &local_a8->a[0].pWLoop;
        for (uVar21 = 0; local_70 != uVar21; uVar21 = uVar21 + 1) {
          pWVar6 = local_f0->aLoop[uVar21];
          *ppWVar19 = pWVar6;
          bVar9 = pWVar6->iTab;
          *(byte *)((long)ppWVar19 + -0x1c) = bVar9;
          *(int *)((long)ppWVar19 + -0x44) = local_a8->pTabList->a[bVar9].iCursor;
          ppWVar19 = ppWVar19 + 0xb;
        }
        if (((((local_a8->wctrlFlags & 0x180) == 0x100) && ((short)local_b0 != 0)) &&
            (local_a8->eDistinct == '\0')) &&
           (iVar10 = wherePathSatisfiesOrderBy
                               (local_a8,local_a8->pResultSet,local_f0,0x80,(short)local_60 - 1,
                                local_f0->aLoop[local_60 - 1],&revMask),
           pWInfo_00->pResultSet->nExpr == (int)iVar10)) {
          pWInfo_00->eDistinct = '\x02';
        }
        pOrderBy = pWInfo_00->pOrderBy;
        if (pOrderBy != (ExprList *)0x0) {
          uVar31 = (uint)pWInfo_00->wctrlFlags;
          cVar2 = local_f0->isOrdered;
          if ((char)pWInfo_00->wctrlFlags < '\0') {
            if (pOrderBy->nExpr == (int)cVar2) {
              pWInfo_00->eDistinct = '\x02';
            }
          }
          else {
            pWInfo_00->nOBSat = cVar2;
            pWInfo_00->revMask = local_f0->revLoop;
            if ((cVar2 < '\x01') && (pWInfo_00->nOBSat = '\0', uVar7 != 0)) {
              uVar27 = (int)uVar7 - 1;
              uVar30 = local_f0->aLoop[uVar27]->wsFlags;
              if ((~uVar30 & 0x104) != 0 && (uVar30 >> 0xc & 1) == 0) {
                revMask = 0;
                iVar10 = wherePathSatisfiesOrderBy
                                   (pWInfo_00,pOrderBy,local_f0,0x800,(u16)uVar27,
                                    local_f0->aLoop[uVar27],&revMask);
                pOrderBy = pWInfo_00->pOrderBy;
                if (pOrderBy->nExpr == (int)iVar10) {
                  pWInfo_00->bOrderedInnerLoop = '\x01';
                  pWInfo_00->revMask = revMask;
                }
                uVar31 = (uint)pWInfo_00->wctrlFlags;
              }
            }
          }
          if ((((uVar31 >> 9 & 1) != 0) && (uVar7 != 0)) &&
             (pOrderBy->nExpr == (int)pWInfo_00->nOBSat)) {
            revMask = 0;
            uVar31 = (int)uVar7 - 1;
            iVar10 = wherePathSatisfiesOrderBy
                               (pWInfo_00,pOrderBy,local_f0,0,(u16)uVar31,local_f0->aLoop[uVar31],
                                &revMask);
            if (pWInfo_00->pOrderBy->nExpr == (int)iVar10) {
              pWInfo_00->sorted = '\x01';
              pWInfo_00->revMask = revMask;
            }
          }
        }
        pWInfo_00->nRowOut = local_f0->nRow;
      }
      sqlite3DbFreeNN(psVar5,pWVar16);
      return extraout_EAX;
    }
    local_38 = uVar21 * 8;
    if ((int)uVar31 < 1) {
      uVar31 = 0;
    }
    local_58 = &local_b8[1].rUnsorted;
    local_80 = (uint)uVar21 & 0xffff;
    pWVar26 = pWVar24;
    local_d0 = uVar21;
    local_7c = uVar31;
    uVar31 = 0;
    for (uVar27 = 0; ppWVar19 = local_48, uVar20 = uVar27, uVar27 != local_7c; uVar27 = uVar27 + 1)
    {
      while (local_d4 = uVar20, pWVar6 = *ppWVar19, pWVar6 != (WhereLoop *)0x0) {
        bVar9 = pWVar26->isOrdered;
        revMask = 0;
        uVar7 = pWVar26->maskLoop;
        if ((((pWVar6->prereq & ~uVar7) == 0) && (uVar8 = pWVar6->maskSelf, (uVar8 & uVar7) == 0))
           && ((sVar22 = pWVar26->nRow, (pWVar6->wsFlags & 0x4000) == 0 || (9 < sVar22)))) {
          local_c8 = uVar31;
          local_c4 = uVar30;
          local_98 = uVar29;
          local_90 = uVar28;
          LVar11 = sqlite3LogEstAdd(pWVar6->rSetup,pWVar6->rRun + sVar22);
          LVar11 = sqlite3LogEstAdd(LVar11,pWVar26->rUnsorted);
          sVar22 = sVar22 + pWVar6->nOut;
          if ((char)bVar9 < '\0') {
            bVar9 = wherePathSatisfiesOrderBy
                              (local_a8,local_a8->pOrderBy,pWVar26,local_a8->wctrlFlags,
                               (u16)local_80,pWVar6,&revMask);
          }
          else {
            revMask = pWVar26->revLoop;
          }
          iVar15 = local_d8 - (char)bVar9;
          iVar25 = (int)local_a0;
          if ((iVar15 == 0 || local_d8 < (char)bVar9) || (char)bVar9 < '\0') {
            sVar23 = LVar11 + -2;
            LVar12 = LVar11;
          }
          else {
            sVar23 = *(short *)((long)local_c0 + (ulong)bVar9 * 2);
            if (sVar23 == 0) {
              local_50 = (ulong)bVar9;
              LVar12 = sqlite3LogEst((long)((iVar15 * 100) / local_d8));
              sVar13 = (short)local_b0;
              sVar23 = sVar13;
              if (((local_a8->wctrlFlags & 0x4000) != 0) &&
                 (sVar23 = (short)*(undefined4 *)&local_a8->iLimit, sVar13 <= sVar23)) {
                sVar23 = sVar13;
              }
              LVar14 = estLog(sVar23);
              sVar23 = LVar12 + LVar14 + (short)local_84;
              *(short *)((long)local_c0 + local_50 * 2) = sVar23;
            }
            LVar12 = sqlite3LogEstAdd(LVar11,sVar23);
            iVar25 = (int)local_a0;
            sVar23 = LVar11;
          }
          pWVar16 = local_b8;
          uVar20 = 0;
          if (0 < (int)local_c8) {
            uVar20 = local_c8;
          }
          while (uVar21 = local_d0, uVar28 = local_90, uVar29 = local_98, uVar27 = local_d4,
                uVar31 = local_c8, uVar30 = local_c4, uVar20 != 0) {
            if ((pWVar16->maskLoop == (uVar8 | uVar7)) && (-1 < (char)(pWVar16->isOrdered ^ bVar9)))
            {
              if ((pWVar16->rCost < LVar12) ||
                 ((pWVar16->rCost == LVar12 &&
                  ((pWVar16->nRow < sVar22 ||
                   ((pWVar16->nRow == sVar22 && (pWVar16->rUnsorted <= sVar23))))))))
              goto LAB_0025f8d1;
              goto LAB_0025f7d0;
            }
            pWVar16 = pWVar16 + 1;
            uVar20 = uVar20 - 1;
          }
          uVar20 = local_c8;
          if (((int)local_c8 < iVar25) ||
             ((LVar12 <= (short)local_98 &&
              ((uVar20 = local_c4, LVar12 != (short)local_98 || (sVar23 < (short)local_90)))))) {
            uVar31 = local_c8 + ((int)local_c8 < iVar25);
            pWVar16 = local_b8 + (int)uVar20;
LAB_0025f7d0:
            pWVar16->maskLoop = pWVar6->maskSelf | pWVar26->maskLoop;
            pWVar16->revLoop = revMask;
            pWVar16->nRow = sVar22;
            pWVar16->rCost = LVar12;
            pWVar16->rUnsorted = sVar23;
            pWVar16->isOrdered = bVar9;
            memcpy(pWVar16->aLoop,pWVar26->aLoop,local_38);
            pWVar16->aLoop[local_d0] = pWVar6;
            uVar21 = local_d0;
            uVar28 = local_90;
            uVar29 = local_98;
            uVar27 = local_d4;
            uVar30 = local_c4;
            if ((int)(uint)local_a0 <= (int)uVar31) {
              uVar28 = (ulong)(ushort)local_b8->nRow;
              uVar29 = (ulong)(ushort)local_b8->rCost;
              uVar30 = 0;
              pLVar18 = local_58;
              for (uVar20 = 1; uVar20 < (uint)local_a0; uVar20 = uVar20 + 1) {
                uVar3 = pLVar18[-1];
                if ((short)(ushort)uVar29 < (short)uVar3) {
                  uVar4 = *pLVar18;
LAB_0025f8a8:
                  uVar28 = (ulong)uVar4;
                  uVar29 = (ulong)uVar3;
                  uVar30 = uVar20;
                }
                else if ((uVar3 == (ushort)uVar29) &&
                        (uVar4 = *pLVar18, (short)uVar28 < (short)uVar4)) goto LAB_0025f8a8;
                pLVar18 = pLVar18 + 0x10;
              }
            }
          }
        }
LAB_0025f8d1:
        uVar20 = local_d4;
        ppWVar19 = &pWVar6->pNextLoop;
      }
      pWVar26 = pWVar26 + 1;
      pWVar16 = local_40;
    }
    uVar21 = uVar21 + 1;
    pWVar26 = local_b8;
    local_b8 = pWVar24;
  } while( true );
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  sqlite3 *db;              /* The database connection */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  db = pParse->db;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d)\n", nRowEst));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3DbMallocRawNN(db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array 
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered, 
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered = pFrom->isOrdered;  /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask = 0;              /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<10 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 2 times. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }
        /* At this point, pWLoop is a candidate to be the next loop. 
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        if( isOrdered<0 ){
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]);

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy, 
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          ** 
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost 
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost 
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted) 
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3DbFreeNN(db, pSpace);
    return SQLITE_ERROR;
  }
  
  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  if( pWInfo->pOrderBy ){
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
    }else{
      pWInfo->nOBSat = pFrom->isOrdered;
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0 
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, 
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }


  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3DbFreeNN(db, pSpace);
  return SQLITE_OK;
}